

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void ProcessEDLinedef(line_t_conflict *ld,int recordnum)

{
  undefined8 uVar1;
  EDLinedef *pEVar2;
  
  InitED();
  pEVar2 = TMap<int,_EDLinedef,_THashTraits<int>,_TValueTraits<EDLinedef>_>::CheckKey
                     (&EDLines,recordnum);
  if (pEVar2 != (EDLinedef *)0x0) {
    ld->special = pEVar2->special;
    ld->activation = pEVar2->activation;
    ld->flags = ld->flags & 0xff7679ff | pEVar2->flags;
    ld->alpha = pEVar2->alpha;
    uVar1 = *(undefined8 *)(pEVar2->args + 2);
    *(undefined8 *)ld->args = *(undefined8 *)pEVar2->args;
    *(undefined8 *)(ld->args + 2) = uVar1;
    ld->args[4] = pEVar2->args[4];
    FTagManager::AddLineID(&tagManager,(int)(((long)ld - (long)lines) / 0x98),pEVar2->tag);
    return;
  }
  Printf("EDF Linedef record %d not found\n",recordnum);
  ld->special = 0;
  return;
}

Assistant:

void ProcessEDLinedef(line_t *ld, int recordnum)
{
	InitED();

	EDLinedef *eld = EDLines.CheckKey(recordnum);
	if (eld == NULL)
	{
		Printf("EDF Linedef record %d not found\n", recordnum);
		ld->special = 0;
		return;
	}
	const DWORD fmask = ML_REPEAT_SPECIAL | ML_FIRSTSIDEONLY | ML_ADDTRANS | ML_BLOCKEVERYTHING | ML_ZONEBOUNDARY | ML_CLIP_MIDTEX;
	ld->special = eld->special;
	ld->activation = eld->activation;
	ld->flags = (ld->flags&~fmask) | eld->flags;
	ld->setAlpha(eld->alpha);
	memcpy(ld->args, eld->args, sizeof(ld->args));
	tagManager.AddLineID(int(ld - lines), eld->tag);
}